

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ttobjs.c
# Opt level: O1

FT_Bool tt_check_single_notdef(FT_Face ttface)

{
  FT_ListNode pFVar1;
  FT_ListNode pFVar2;
  bool bVar3;
  FT_Error FVar4;
  FT_ListNode pFVar5;
  int iVar6;
  FT_ListNode pFVar7;
  bool bVar8;
  char local_3c;
  undefined7 uStack_3b;
  char buf [8];
  FT_UInt asize;
  
  pFVar1 = ttface[4].sizes_list.tail;
  iVar6 = 0;
  bVar8 = false;
  if (pFVar1 == (FT_ListNode)0x0) {
    pFVar5 = (FT_ListNode)0x0;
  }
  else {
    pFVar5 = (FT_ListNode)0x0;
    pFVar7 = (FT_ListNode)0x0;
    do {
      tt_face_get_location((TT_Face)ttface,(FT_UInt)pFVar7,(FT_UInt *)buf);
      pFVar2 = pFVar5;
      bVar3 = bVar8;
      if (buf._0_4_ != 0) {
        iVar6 = 1;
        pFVar2 = pFVar7;
        bVar3 = true;
        if (bVar8) {
          iVar6 = 2;
          break;
        }
      }
      bVar8 = bVar3;
      pFVar5 = pFVar2;
      pFVar7 = (FT_ListNode)((long)&pFVar7->prev + 1);
    } while (pFVar1 != pFVar7);
    bVar8 = iVar6 == 1;
  }
  if (bVar8) {
    if (pFVar5 == (FT_ListNode)0x0) {
      bVar8 = true;
    }
    else {
      FVar4 = FT_Get_Glyph_Name(ttface,(FT_UInt)pFVar5,&local_3c,8);
      bVar8 = false;
      if ((FVar4 == 0) && (local_3c == '.')) {
        bVar8 = CONCAT71(uStack_3b,0x2e) == 0x666564746f6e2e;
      }
    }
  }
  else {
    bVar8 = false;
  }
  return bVar8;
}

Assistant:

static FT_Bool
  tt_check_single_notdef( FT_Face  ttface )
  {
    FT_Bool   result = FALSE;

    TT_Face   face = (TT_Face)ttface;
    FT_UInt   asize;
    FT_ULong  i;
    FT_ULong  glyph_index = 0;
    FT_UInt   count       = 0;


    for( i = 0; i < face->num_locations; i++ )
    {
      tt_face_get_location( face, i, &asize );
      if ( asize > 0 )
      {
        count += 1;
        if ( count > 1 )
          break;
        glyph_index = i;
      }
    }

    /* Only have a single outline. */
    if ( count == 1 )
    {
      if ( glyph_index == 0 )
        result = TRUE;
      else
      {
        /* FIXME: Need to test glyphname == .notdef ? */
        FT_Error error;
        char buf[8];


        error = FT_Get_Glyph_Name( ttface, glyph_index, buf, 8 );
        if ( !error                                            &&
             buf[0] == '.' && !ft_strncmp( buf, ".notdef", 8 ) )
          result = TRUE;
      }
    }

    return result;
  }